

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O1

FT_F26Dot6 Round_To_Double_Grid(TT_ExecContext exc,FT_F26Dot6 distance,FT_F26Dot6 compensation)

{
  ulong uVar1;
  ulong uVar2;
  
  if (-1 < distance) {
    uVar1 = distance + compensation + 0x10;
    uVar2 = 0;
    if (-1 < (long)uVar1) {
      uVar2 = uVar1 & 0xffffffffffffffe0;
    }
    return uVar2;
  }
  uVar2 = -((compensation - distance) + 0x10U & 0xffffffffffffffe0);
  return (long)uVar2 >> 0x3f & uVar2;
}

Assistant:

static FT_F26Dot6
  Round_To_Double_Grid( TT_ExecContext  exc,
                        FT_F26Dot6      distance,
                        FT_F26Dot6      compensation )
  {
    FT_F26Dot6  val;

    FT_UNUSED( exc );


    if ( distance >= 0 )
    {
      val = FT_PAD_ROUND_LONG( ADD_LONG( distance, compensation ), 32 );
      if ( val < 0 )
        val = 0;
    }
    else
    {
      val = NEG_LONG( FT_PAD_ROUND_LONG( SUB_LONG( compensation, distance ),
                                         32 ) );
      if ( val > 0 )
        val = 0;
    }

    return val;
  }